

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_winograd.h
# Opt level: O3

int ncnn::conv3x3s1_winograd63(Mat *bottom_blob,Mat *top_blob,Mat *AT,Mat *bias,int nT,Option *opt)

{
  ulong uVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  size_t sVar4;
  size_t sVar5;
  float fVar6;
  float fVar7;
  int *piVar8;
  Mat *pMVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  undefined1 (*pauVar18) [32];
  undefined1 (*pauVar19) [16];
  void *pvVar20;
  float *pfVar21;
  float *pfVar22;
  void *pvVar23;
  int iVar24;
  uint uVar25;
  long lVar26;
  int iVar27;
  void *pvVar28;
  ulong uVar29;
  int iVar30;
  int iVar31;
  long lVar32;
  undefined8 *puVar33;
  undefined8 *puVar34;
  long lVar35;
  int iVar36;
  int iVar37;
  float *pfVar38;
  int iVar39;
  int K;
  uint uVar40;
  uint uVar41;
  uint uVar42;
  float fVar43;
  float fVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  float fVar47;
  undefined1 auVar49 [16];
  float fVar48;
  float fVar54;
  float fVar56;
  undefined1 auVar50 [16];
  float fVar53;
  float fVar55;
  float fVar58;
  float fVar59;
  float fVar60;
  undefined1 auVar51 [32];
  float fVar57;
  float fVar61;
  undefined1 auVar52 [32];
  float fVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  undefined1 auVar68 [32];
  float fVar77;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar82;
  float fVar83;
  float fVar88;
  float fVar89;
  float fVar90;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [32];
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [32];
  undefined1 in_ZMM8 [64];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [32];
  undefined1 in_ZMM9 [64];
  undefined1 auVar128 [16];
  undefined1 auVar129 [32];
  undefined1 in_ZMM10 [64];
  undefined1 auVar130 [16];
  undefined1 in_ZMM11 [64];
  undefined1 auVar131 [64];
  undefined1 auVar132 [64];
  int TILE_M;
  int TILE_K;
  int TILE_N;
  Mat m;
  float tmp [6] [8] [8];
  Allocator *_allocator;
  long local_888;
  ulong local_850;
  int local_810;
  uint local_80c;
  long local_808;
  ulong local_800;
  Mat *local_7f8;
  void *local_7f0;
  void *local_7e8;
  long local_7e0;
  void *local_7d8;
  void *local_7d0;
  Mat *local_7c8;
  int local_7c0;
  int local_7bc;
  int local_7b8;
  uint local_7b4;
  long local_7b0;
  ulong local_7a8;
  Mat local_7a0;
  ulong local_750;
  ulong local_748;
  ulong local_740;
  long local_738;
  void *local_730;
  int local_724;
  Mat local_720;
  ulong local_6d8;
  Mat local_6d0;
  ulong local_688;
  Mat *local_680;
  Mat *local_678;
  void *local_670;
  ulong local_668;
  undefined1 local_660 [8];
  float afStack_658 [4];
  float afStack_648 [2];
  Allocator *local_640;
  int iStack_638;
  int iStack_634;
  int iStack_630;
  undefined8 uStack_62c;
  float fStack_624;
  size_t local_620 [4];
  float local_600 [8];
  float local_5e0 [8];
  float local_5c0 [8];
  float local_5a0 [8];
  float local_580 [8];
  undefined8 auStack_560 [8];
  undefined8 auStack_520 [8];
  undefined8 auStack_4e0 [16];
  undefined1 auStack_460 [128];
  undefined1 auStack_3e0 [128];
  undefined1 auStack_360 [256];
  undefined1 auStack_260 [256];
  undefined1 auStack_160 [256];
  undefined1 auStack_60 [48];
  undefined1 auVar69 [32];
  undefined1 auVar81 [32];
  undefined1 auVar87 [32];
  undefined1 auVar98 [32];
  undefined1 auVar107 [32];
  
  uVar40 = top_blob->elempack * top_blob->c;
  uVar41 = ((top_blob->h + 5) / 6) * ((top_blob->w + 5) / 6);
  K = bottom_blob->elempack * bottom_blob->c;
  local_7c8 = top_blob;
  local_680 = AT;
  local_678 = bias;
  get_optimal_tile_mnk(uVar40,uVar41,K,(int *)&local_80c,(int *)&local_7b4,&local_7b8,nT);
  uVar42 = local_7b4;
  iVar11 = local_7b8;
  local_7c0 = (int)(uVar40 + local_80c + -1) / (int)local_80c;
  iVar36 = (int)(uVar41 + local_7b4 + -1) / (int)local_7b4;
  iVar24 = (local_7b8 + K + -1) / local_7b8;
  iVar27 = local_7b8 * local_7b4;
  _allocator = opt->workspace_allocator;
  local_720.cstep = 0;
  local_720.data = (void *)0x0;
  local_720.refcount._0_4_ = 0;
  local_720.refcount._4_4_ = 0;
  local_720.elemsize._0_4_ = 0;
  local_720.elemsize._4_4_ = 0;
  local_720.elempack = 0;
  local_720.allocator = (Allocator *)0x0;
  local_720.dims = 0;
  local_720.w = 0;
  local_720.h = 0;
  local_720.d = 0;
  local_720.c = 0;
  local_800 = (ulong)uVar41;
  local_688 = (ulong)uVar40;
  Mat::create(&local_720,iVar27,0x40,iVar24,iVar36,4,_allocator);
  iVar10 = -100;
  if ((local_720.data == (void *)0x0) || ((long)local_720.c * local_720.cstep == 0))
  goto LAB_0021227a;
  iVar36 = iVar36 * iVar24;
  iVar27 = iVar27 * 0x40;
  if ((nT < 2) || (nT <= iVar36)) {
    local_620[0] = 0;
    local_660 = (undefined1  [8])0x0;
    afStack_658[0] = 0.0;
    afStack_658[1] = 0.0;
    afStack_658[2] = 0.0;
    afStack_658[3] = 0.0;
    afStack_648[0] = 0.0;
    local_640 = (Allocator *)0x0;
    iStack_638 = 0;
    iStack_634 = 0;
    iStack_630 = 0;
    uStack_62c._0_4_ = 0;
    uStack_62c._4_4_ = 0;
    Mat::create((Mat *)local_660,iVar27,1,nT,4,opt->workspace_allocator);
    if ((local_660 == (undefined1  [8])0x0) || ((long)uStack_62c._4_4_ * local_620[0] == 0)) {
      piVar8 = (int *)CONCAT44(afStack_658[1],afStack_658[0]);
      iVar10 = -100;
      if (piVar8 == (int *)0x0) goto LAB_0021227a;
      LOCK();
      *piVar8 = *piVar8 + -1;
      UNLOCK();
      if (*piVar8 != 0) goto LAB_0021227a;
      if (local_640 != (Allocator *)0x0) {
        (*local_640->_vptr_Allocator[3])();
        iVar10 = -100;
        goto LAB_0021227a;
      }
      goto LAB_002106c2;
    }
    if (0 < iVar36) {
      iVar10 = 0;
      do {
        iVar27 = uVar42 * (iVar10 / iVar24);
        iVar37 = iVar11 * (iVar10 % iVar24);
        uVar40 = (int)local_800 - iVar27;
        if ((int)uVar42 < (int)uVar40) {
          uVar40 = uVar42;
        }
        iVar39 = K - iVar37;
        if (iVar11 < iVar39) {
          iVar39 = iVar11;
        }
        iVar30 = get_omp_thread_num();
        local_7a0.elemsize = CONCAT44(afStack_658[3],afStack_658[2]);
        local_7a0.data =
             (void *)((long)iVar30 * local_620[0] * local_7a0.elemsize + (long)local_660);
        local_7a0.refcount._0_4_ = 0;
        local_7a0.refcount._4_4_ = 0;
        local_7a0.elempack = (int)afStack_648[0];
        local_7a0.allocator = local_640;
        local_7a0.w = iStack_634;
        local_7a0.h = iStack_630;
        local_7a0.d = 1;
        local_7a0.c = (int)uStack_62c;
        local_7a0.dims = iStack_638 + -1;
        local_7a0.cstep =
             (local_7a0.elemsize * (long)iStack_630 * (long)iStack_634 + 0xf & 0xfffffffffffffff0) /
             local_7a0.elemsize;
        if (iStack_638 == 4) {
          local_7a0.cstep = (long)iStack_630 * (long)iStack_634;
        }
        conv3x3s1_winograd63_transform_input_tile
                  (bottom_blob,&local_7a0,iVar27,uVar40,iVar37,iVar39,(int)_allocator);
        local_6d0.elemsize = CONCAT44(local_720.elemsize._4_4_,(undefined4)local_720.elemsize);
        local_6d0.cstep = (long)local_720.h * (long)local_720.w;
        local_6d0.data =
             (void *)((long)local_720.data +
                     (uint)(iVar10 % iVar24) * local_6d0.elemsize * local_6d0.cstep +
                     (long)(iVar10 / iVar24) * local_720.cstep * local_6d0.elemsize);
        local_6d0.refcount = (int *)0x0;
        local_6d0.elempack = local_720.elempack;
        local_6d0.allocator = local_720.allocator;
        local_6d0.dims = 2;
        local_6d0.w = local_720.w;
        local_6d0.h = local_720.h;
        local_6d0.d = 1;
        local_6d0.c = 1;
        transpose_pack_B_tile(&local_7a0,&local_6d0,0x40,uVar40,iVar39,(int)local_6d0.cstep);
        iVar10 = iVar10 + 1;
      } while (iVar36 != iVar10);
    }
    uVar29 = local_800;
    piVar8 = (int *)CONCAT44(afStack_658[1],afStack_658[0]);
    if (piVar8 != (int *)0x0) {
      LOCK();
      *piVar8 = *piVar8 + -1;
      UNLOCK();
      if (*piVar8 == 0) {
        if (local_640 == (Allocator *)0x0) goto LAB_002106dd;
        (*local_640->_vptr_Allocator[3])();
      }
    }
  }
  else {
    local_620[0] = 0;
    local_660 = (undefined1  [8])0x0;
    afStack_658[0] = 0.0;
    afStack_658[1] = 0.0;
    afStack_658[2] = 0.0;
    afStack_658[3] = 0.0;
    afStack_648[0] = 0.0;
    local_640 = (Allocator *)0x0;
    iStack_638 = 0;
    iStack_634 = 0;
    iStack_630 = 0;
    uStack_62c._0_4_ = 0;
    uStack_62c._4_4_ = 0;
    Mat::create((Mat *)local_660,iVar27,4,opt->workspace_allocator);
    if ((local_660 == (undefined1  [8])0x0) || ((long)uStack_62c._4_4_ * local_620[0] == 0)) {
      piVar8 = (int *)CONCAT44(afStack_658[1],afStack_658[0]);
      iVar10 = -100;
      if (piVar8 == (int *)0x0) goto LAB_0021227a;
      LOCK();
      *piVar8 = *piVar8 + -1;
      UNLOCK();
      if (*piVar8 != 0) goto LAB_0021227a;
      if (local_640 != (Allocator *)0x0) {
        (*local_640->_vptr_Allocator[3])();
        iVar10 = -100;
        goto LAB_0021227a;
      }
LAB_002106c2:
      iVar10 = -100;
      if (local_660 != (undefined1  [8])0x0) {
        free((void *)local_660);
        iVar10 = -100;
      }
      goto LAB_0021227a;
    }
    if (0 < iVar36) {
      iVar10 = 0;
      do {
        iVar27 = uVar42 * (iVar10 / iVar24);
        iVar37 = iVar11 * (int)((long)iVar10 % (long)iVar24);
        uVar40 = (int)local_800 - iVar27;
        if ((int)uVar42 < (int)uVar40) {
          uVar40 = uVar42;
        }
        iVar39 = K - iVar37;
        if (iVar11 < iVar39) {
          iVar39 = iVar11;
        }
        conv3x3s1_winograd63_transform_input_tile
                  (bottom_blob,(Mat *)local_660,iVar27,uVar40,iVar37,iVar39,(int)_allocator);
        local_7a0.elemsize = CONCAT44(local_720.elemsize._4_4_,(undefined4)local_720.elemsize);
        local_7a0.cstep = (long)local_720.h * (long)local_720.w;
        local_7a0.data =
             (void *)((long)local_720.data +
                     ((long)iVar10 % (long)iVar24 & 0xffffffffU) * local_7a0.elemsize *
                     local_7a0.cstep +
                     (long)(iVar10 / iVar24) * local_720.cstep * local_7a0.elemsize);
        local_7a0.refcount._0_4_ = 0;
        local_7a0.refcount._4_4_ = 0;
        local_7a0.elempack = local_720.elempack;
        local_7a0.allocator = local_720.allocator;
        local_7a0.dims = 2;
        local_7a0.w = local_720.w;
        local_7a0.h = local_720.h;
        local_7a0.d = 1;
        local_7a0.c = 1;
        transpose_pack_B_tile((Mat *)local_660,&local_7a0,0x40,uVar40,iVar39,(int)local_7a0.cstep);
        iVar10 = iVar10 + 1;
      } while (iVar36 != iVar10);
    }
    uVar29 = local_800;
    piVar8 = (int *)CONCAT44(afStack_658[1],afStack_658[0]);
    if (piVar8 != (int *)0x0) {
      LOCK();
      *piVar8 = *piVar8 + -1;
      UNLOCK();
      if (*piVar8 == 0) {
        if (local_640 == (Allocator *)0x0) {
LAB_002106dd:
          uVar29 = local_800;
          if (local_660 != (undefined1  [8])0x0) {
            free((void *)local_660);
          }
        }
        else {
          (*local_640->_vptr_Allocator[3])();
        }
      }
    }
  }
  uVar42 = local_7b4;
  local_7a0.cstep = 0;
  local_7a0.data = (Allocator *)0x0;
  local_7a0.refcount._0_4_ = 0;
  local_7a0.refcount._4_4_ = 0;
  local_7a0.elemsize = SUB168(ZEXT816(0) << 0x40,4);
  local_7a0.elempack = 0;
  local_7a0.h = 0;
  local_7a0.allocator = (Allocator *)local_7a0.data;
  local_7a0.dims = (int)local_7a0.refcount;
  local_7a0.w = local_7a0.refcount._4_4_;
  local_7a0.d = (int)local_7a0.refcount;
  local_7a0.c = local_7a0.elempack;
  Mat::create(&local_7a0,local_80c * local_7b4 * 0x40,1,nT,4,opt->workspace_allocator);
  iVar10 = -100;
  if (((Allocator *)local_7a0.data != (Allocator *)0x0) &&
     ((long)local_7a0.c * local_7a0.cstep != 0)) {
    if (0 < local_7c0) {
      local_810 = 0;
      do {
        uVar41 = local_80c;
        in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
        in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
        in_ZMM10 = ZEXT1664(in_ZMM10._0_16_);
        in_ZMM11 = ZEXT1664(in_ZMM11._0_16_);
        iVar11 = get_omp_thread_num();
        uVar25 = uVar41 * local_810;
        uVar40 = (int)local_688 - uVar25;
        if ((int)uVar41 < (int)uVar40) {
          uVar40 = uVar41;
        }
        if (0 < (int)uVar29) {
          local_7f8 = (Mat *)((long)(_func_int ***)local_7a0.data +
                             (long)iVar11 * local_7a0.cstep * local_7a0.elemsize);
          local_808 = (long)(int)uVar25;
          local_738 = (long)(int)uVar40;
          iVar11 = 0;
          local_748 = (ulong)uVar25;
          local_668 = (ulong)uVar40;
          do {
            pMVar9 = local_680;
            iVar10 = local_7b8;
            uVar41 = (int)uVar29 - iVar11;
            if ((int)uVar42 < (int)uVar41) {
              uVar41 = uVar42;
            }
            pvVar28 = (void *)(ulong)uVar41;
            if (0 < K) {
              iVar27 = (int)local_748;
              lVar13 = (long)(int)local_80c;
              uVar29 = local_748 & 0xffffffff;
              iVar36 = 0;
              iVar24 = K;
              do {
                iVar37 = iVar24;
                if (iVar10 < iVar24) {
                  iVar37 = iVar10;
                }
                iStack_634 = pMVar9->w;
                iStack_630 = pMVar9->h;
                sVar4 = pMVar9->elemsize;
                afStack_648[0] = (float)pMVar9->elempack;
                local_640 = pMVar9->allocator;
                local_620[0] = (long)iStack_630 * (long)iStack_634;
                local_660 = (undefined1  [8])
                            ((long)pMVar9->data +
                            sVar4 * local_620[0] * (long)(iVar36 / iVar10) +
                            pMVar9->cstep *
                            (long)(int)((long)((ulong)(uint)(iVar27 >> 0x1f) << 0x20 | uVar29) /
                                       lVar13) * sVar4);
                afStack_658[0] = 0.0;
                afStack_658[1] = 0.0;
                afStack_658[2] = (float)sVar4;
                afStack_658[3] = (float)(sVar4 >> 0x20);
                iStack_638 = 2;
                uStack_62c._0_4_ = 1;
                uStack_62c._4_4_ = 1;
                local_6d0.elemsize =
                     CONCAT44(local_720.elemsize._4_4_,(undefined4)local_720.elemsize);
                local_6d0.cstep = (long)local_720.h * (long)local_720.w;
                local_6d0.data =
                     (void *)((long)local_720.data +
                             local_6d0.elemsize * local_6d0.cstep * (long)(iVar36 / iVar10) +
                             local_720.cstep * (long)(iVar11 / (int)uVar42) * local_6d0.elemsize);
                local_6d0.refcount = (int *)0x0;
                local_6d0.elempack = local_720.elempack;
                local_6d0.allocator = local_720.allocator;
                local_6d0.dims = 2;
                local_6d0.w = local_720.w;
                local_6d0.h = local_720.h;
                local_6d0.d = 1;
                local_6d0.c = 1;
                iVar24 = -(iVar10 - iVar24);
                in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
                in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
                in_ZMM10 = ZEXT1664(in_ZMM10._0_16_);
                in_ZMM11 = ZEXT1664(in_ZMM11._0_16_);
                gemm_transB_packed_tile
                          ((Mat *)local_660,&local_6d0,local_7f8,0x40,uVar40,uVar41,iVar36,iVar37);
                iVar36 = iVar36 + iVar10;
              } while (iVar36 < K);
            }
            iVar10 = local_7c8->w;
            iVar24 = local_7c8->elempack;
            uVar25 = (int)local_7c8->cstep * iVar24;
            local_750 = (ulong)uVar25;
            uVar42 = (iVar10 + 5) / 6;
            local_7a8 = (ulong)uVar42;
            local_7bc = uVar41 * 0x40;
            uVar29 = 0;
            local_7f0 = local_678->data;
            local_7b0 = (long)local_7c8->h;
            if (7 < (int)uVar40) {
              local_7e8 = (void *)(long)(int)(uVar41 * 0x18);
              local_7e0 = (long)(int)uVar25;
              lVar32 = (long)(int)(uVar25 * 2);
              lVar13 = (long)(int)(uVar25 * 3);
              lVar14 = (long)(int)(uVar25 * 4);
              lVar15 = (long)(int)(uVar25 * 5);
              lVar16 = (long)(int)(uVar25 * 6);
              lVar17 = (long)(int)(uVar25 * 7);
              local_724 = uVar41 * 0x200;
              local_670 = (void *)((long)local_7f0 + local_808 * 4);
              local_740 = 0;
              uVar29 = 0;
              do {
                local_6d8 = uVar29;
                if (local_7f0 == (void *)0x0) {
                  auVar46 = ZEXT1632(ZEXT816(0) << 0x40);
                }
                else {
                  auVar46 = *(undefined1 (*) [32])((long)local_670 + local_6d8 * 4);
                }
                if (0 < (int)uVar41) {
                  pfVar21 = (float *)((long)&local_7f8->data + (long)(int)local_740 * 4);
                  local_7d8 = (void *)(long)(((int)local_748 + (int)local_6d8) / iVar24);
                  pvVar20 = (void *)0x0;
                  do {
                    local_7d0 = pvVar20;
                    iVar27 = iVar11 + (int)local_7d0;
                    lVar26 = -0x100;
                    pfVar22 = pfVar21;
                    auVar132 = in_ZMM11;
                    do {
                      auVar51 = *(undefined1 (*) [32])(pfVar22 + (int)(uVar41 * 8));
                      auVar68 = *(undefined1 (*) [32])(pfVar22 + (int)(uVar41 * 0x10));
                      auVar52 = *(undefined1 (*) [32])(pfVar22 + (long)local_7e8);
                      auVar106 = *(undefined1 (*) [32])(pfVar22 + (int)(uVar41 << 5));
                      auVar124 = *(undefined1 (*) [32])(pfVar22 + (int)(uVar41 * 0x28));
                      auVar127 = *(undefined1 (*) [32])(pfVar22 + (int)(uVar41 * 0x30));
                      fVar108 = auVar68._0_4_ + auVar51._0_4_;
                      fVar110 = auVar68._4_4_ + auVar51._4_4_;
                      fVar112 = auVar68._8_4_ + auVar51._8_4_;
                      fVar114 = auVar68._12_4_ + auVar51._12_4_;
                      fVar116 = auVar68._16_4_ + auVar51._16_4_;
                      fVar118 = auVar68._20_4_ + auVar51._20_4_;
                      fVar120 = auVar68._24_4_ + auVar51._24_4_;
                      fVar121 = auVar68._28_4_ + auVar51._28_4_;
                      auVar51 = vsubps_avx(auVar51,auVar68);
                      fVar62 = auVar106._0_4_ + auVar52._0_4_;
                      fVar70 = auVar106._4_4_ + auVar52._4_4_;
                      fVar71 = auVar106._8_4_ + auVar52._8_4_;
                      fVar72 = auVar106._12_4_ + auVar52._12_4_;
                      fVar73 = auVar106._16_4_ + auVar52._16_4_;
                      fVar74 = auVar106._20_4_ + auVar52._20_4_;
                      fVar75 = auVar106._24_4_ + auVar52._24_4_;
                      fVar76 = auVar106._28_4_ + auVar52._28_4_;
                      auVar68 = vsubps_avx(auVar52,auVar106);
                      fVar83 = auVar127._0_4_ + auVar124._0_4_;
                      fVar88 = auVar127._4_4_ + auVar124._4_4_;
                      fVar89 = auVar127._8_4_ + auVar124._8_4_;
                      fVar90 = auVar127._12_4_ + auVar124._12_4_;
                      fVar91 = auVar127._16_4_ + auVar124._16_4_;
                      fVar92 = auVar127._20_4_ + auVar124._20_4_;
                      fVar93 = auVar127._24_4_ + auVar124._24_4_;
                      fVar94 = auVar127._28_4_ + auVar124._28_4_;
                      auVar52 = vsubps_avx(auVar124,auVar127);
                      auVar106._0_4_ = fVar83 * 32.0 + fVar62 + fVar108 + *pfVar22;
                      auVar106._4_4_ = fVar88 * 32.0 + fVar70 + fVar110 + pfVar22[1];
                      auVar106._8_4_ = fVar89 * 32.0 + fVar71 + fVar112 + pfVar22[2];
                      auVar106._12_4_ = fVar90 * 32.0 + fVar72 + fVar114 + pfVar22[3];
                      auVar106._16_4_ = fVar91 * 32.0 + fVar73 + fVar116 + pfVar22[4];
                      auVar106._20_4_ = fVar92 * 32.0 + fVar74 + fVar118 + pfVar22[5];
                      auVar106._24_4_ = fVar93 * 32.0 + fVar75 + fVar120 + pfVar22[6];
                      auVar106._28_4_ = in_ZMM8._28_4_ + fVar76 + fVar121 + pfVar22[7];
                      fVar44 = auVar68._0_4_;
                      fVar6 = auVar68._4_4_;
                      fVar48 = auVar68._8_4_;
                      fVar56 = auVar68._12_4_;
                      fVar53 = auVar68._16_4_;
                      fVar57 = auVar68._20_4_;
                      fVar59 = auVar68._24_4_;
                      fVar61 = auVar68._28_4_;
                      fVar43 = auVar51._0_4_;
                      fVar7 = auVar51._4_4_;
                      fVar54 = auVar51._8_4_;
                      fVar47 = auVar51._12_4_;
                      fVar55 = auVar51._16_4_;
                      fVar58 = auVar51._20_4_;
                      fVar60 = auVar51._24_4_;
                      fVar77 = auVar51._28_4_;
                      fVar82 = auVar52._0_4_;
                      fVar109 = auVar52._4_4_;
                      fVar111 = auVar52._8_4_;
                      fVar113 = auVar52._12_4_;
                      fVar115 = auVar52._16_4_;
                      fVar117 = auVar52._20_4_;
                      fVar119 = auVar52._24_4_;
                      auVar124._0_4_ = fVar44 + fVar44 + fVar43 + fVar82 * 16.0;
                      auVar124._4_4_ = fVar6 + fVar6 + fVar7 + fVar109 * 16.0;
                      auVar124._8_4_ = fVar48 + fVar48 + fVar54 + fVar111 * 16.0;
                      auVar124._12_4_ = fVar56 + fVar56 + fVar47 + fVar113 * 16.0;
                      auVar124._16_4_ = fVar53 + fVar53 + fVar55 + fVar115 * 16.0;
                      auVar124._20_4_ = fVar57 + fVar57 + fVar58 + fVar117 * 16.0;
                      auVar124._24_4_ = fVar59 + fVar59 + fVar60 + fVar119 * 16.0;
                      auVar124._28_4_ = fVar61 + fVar61 + fVar77 + in_ZMM9._28_4_;
                      in_ZMM8 = ZEXT3264(auVar124);
                      auVar127._0_4_ = fVar62 * 4.0 + fVar108 + fVar83 * 8.0;
                      auVar127._4_4_ = fVar70 * 4.0 + fVar110 + fVar88 * 8.0;
                      auVar127._8_4_ = fVar71 * 4.0 + fVar112 + fVar89 * 8.0;
                      auVar127._12_4_ = fVar72 * 4.0 + fVar114 + fVar90 * 8.0;
                      auVar127._16_4_ = fVar73 * 4.0 + fVar116 + fVar91 * 8.0;
                      auVar127._20_4_ = fVar74 * 4.0 + fVar118 + fVar92 * 8.0;
                      auVar127._24_4_ = fVar75 * 4.0 + fVar120 + fVar93 * 8.0;
                      auVar127._28_4_ = in_ZMM9._28_4_ + fVar121 + in_ZMM10._28_4_;
                      in_ZMM9 = ZEXT3264(auVar127);
                      auVar131._0_4_ = fVar82 * 4.0;
                      auVar131._4_4_ = fVar109 * 4.0;
                      auVar131._8_4_ = fVar111 * 4.0;
                      auVar131._12_4_ = fVar113 * 4.0;
                      auVar131._16_4_ = fVar115 * 4.0;
                      auVar131._20_4_ = fVar117 * 4.0;
                      auVar131._28_36_ = auVar132._28_36_;
                      auVar131._24_4_ = fVar119 * 4.0;
                      in_ZMM11 = ZEXT3264(auVar131._0_32_);
                      auVar129._0_4_ = fVar44 * 8.0 + fVar43 + auVar131._0_4_;
                      auVar129._4_4_ = fVar6 * 8.0 + fVar7 + auVar131._4_4_;
                      auVar129._8_4_ = fVar48 * 8.0 + fVar54 + auVar131._8_4_;
                      auVar129._12_4_ = fVar56 * 8.0 + fVar47 + auVar131._12_4_;
                      auVar129._16_4_ = fVar53 * 8.0 + fVar55 + auVar131._16_4_;
                      auVar129._20_4_ = fVar57 * 8.0 + fVar58 + auVar131._20_4_;
                      auVar129._24_4_ = fVar59 * 8.0 + fVar60 + auVar131._24_4_;
                      auVar129._28_4_ = in_ZMM10._28_4_ + fVar77 + auVar132._28_4_;
                      in_ZMM10 = ZEXT3264(auVar129);
                      auVar68._0_4_ = fVar62 * 16.0 + fVar108 + fVar83 + fVar83;
                      auVar68._4_4_ = fVar70 * 16.0 + fVar110 + fVar88 + fVar88;
                      auVar68._8_4_ = fVar71 * 16.0 + fVar112 + fVar89 + fVar89;
                      auVar68._12_4_ = fVar72 * 16.0 + fVar114 + fVar90 + fVar90;
                      auVar68._16_4_ = fVar73 * 16.0 + fVar116 + fVar91 + fVar91;
                      auVar68._20_4_ = fVar74 * 16.0 + fVar118 + fVar92 + fVar92;
                      auVar68._24_4_ = fVar75 * 16.0 + fVar120 + fVar93 + fVar93;
                      auVar68._28_4_ = fVar76 + fVar121 + fVar94 + fVar94;
                      pfVar38 = pfVar22 + (int)(uVar41 * 0x38);
                      auVar51._0_4_ = fVar44 * 32.0 + fVar43 + *pfVar38 + fVar82;
                      auVar51._4_4_ = fVar6 * 32.0 + fVar7 + pfVar38[1] + fVar109;
                      auVar51._8_4_ = fVar48 * 32.0 + fVar54 + pfVar38[2] + fVar111;
                      auVar51._12_4_ = fVar56 * 32.0 + fVar47 + pfVar38[3] + fVar113;
                      auVar51._16_4_ = fVar53 * 32.0 + fVar55 + pfVar38[4] + fVar115;
                      auVar51._20_4_ = fVar57 * 32.0 + fVar58 + pfVar38[5] + fVar117;
                      auVar51._24_4_ = fVar59 * 32.0 + fVar60 + pfVar38[6] + fVar119;
                      auVar51._28_4_ = fVar61 + fVar77 + pfVar38[7] + auVar52._28_4_;
                      *(undefined1 (*) [32])((long)auStack_560 + lVar26) = auVar106;
                      *(undefined1 (*) [32])(auStack_460 + lVar26) = auVar124;
                      *(undefined1 (*) [32])(auStack_360 + lVar26) = auVar127;
                      *(undefined1 (*) [32])(auStack_260 + lVar26) = auVar129;
                      *(undefined1 (*) [32])(auStack_160 + lVar26) = auVar68;
                      *(undefined1 (*) [32])(auStack_60 + lVar26) = auVar51;
                      pfVar22 = pfVar22 + local_7bc;
                      lVar26 = lVar26 + 0x20;
                      auVar132 = in_ZMM11;
                    } while (lVar26 != 0);
                    iVar39 = iVar27 % (int)uVar42;
                    lVar35 = (long)((iVar27 / (int)uVar42) * 6);
                    pauVar18 = (undefined1 (*) [32])
                               ((long)local_7c8->data +
                               (long)(iVar39 * 6 * iVar24) * 4 +
                               (long)local_7c8->w * local_7c8->elemsize * lVar35 +
                               local_7c8->cstep * (long)local_7d8 * local_7c8->elemsize);
                    iVar30 = iVar39 * 6 + 1;
                    iVar27 = iVar39 * 6 + 2;
                    iVar36 = iVar39 * 6 + 3;
                    iVar37 = iVar39 * 6 + 4;
                    iVar39 = iVar39 * 6 + 5;
                    pfVar22 = local_580;
                    lVar26 = 0;
                    do {
                      if (lVar26 < local_7b0 - lVar35) {
                        auVar51 = *(undefined1 (*) [32])(pfVar22 + -0x30);
                        auVar68 = *(undefined1 (*) [32])(pfVar22 + -0x28);
                        auVar52 = *(undefined1 (*) [32])(pfVar22 + -0x20);
                        auVar106 = *(undefined1 (*) [32])(pfVar22 + -0x18);
                        auVar124 = *(undefined1 (*) [32])(pfVar22 + -0x10);
                        auVar127 = *(undefined1 (*) [32])(pfVar22 + -8);
                        auVar129 = vsubps_avx(auVar51,auVar68);
                        fVar71 = auVar106._0_4_ + auVar52._0_4_;
                        fVar72 = auVar106._4_4_ + auVar52._4_4_;
                        fVar73 = auVar106._8_4_ + auVar52._8_4_;
                        fVar74 = auVar106._12_4_ + auVar52._12_4_;
                        fVar75 = auVar106._16_4_ + auVar52._16_4_;
                        fVar76 = auVar106._20_4_ + auVar52._20_4_;
                        fVar83 = auVar106._24_4_ + auVar52._24_4_;
                        auVar69 = vsubps_avx(auVar52,auVar106);
                        in_ZMM9 = ZEXT3264(auVar69);
                        fVar88 = auVar127._0_4_ + auVar124._0_4_;
                        fVar89 = auVar127._4_4_ + auVar124._4_4_;
                        fVar90 = auVar127._8_4_ + auVar124._8_4_;
                        fVar91 = auVar127._12_4_ + auVar124._12_4_;
                        fVar92 = auVar127._16_4_ + auVar124._16_4_;
                        fVar93 = auVar127._20_4_ + auVar124._20_4_;
                        fVar94 = auVar127._24_4_ + auVar124._24_4_;
                        fVar108 = auVar127._28_4_ + auVar124._28_4_;
                        in_ZMM10 = ZEXT3264(CONCAT428(fVar108,CONCAT424(fVar94,CONCAT420(fVar93,
                                                  CONCAT416(fVar92,CONCAT412(fVar91,CONCAT48(fVar90,
                                                  CONCAT44(fVar89,fVar88))))))));
                        auVar124 = vsubps_avx(auVar124,auVar127);
                        in_ZMM11 = ZEXT3264(auVar124);
                        fVar47 = auVar51._0_4_ + auVar46._0_4_ + auVar68._0_4_;
                        fVar53 = auVar51._4_4_ + auVar46._4_4_ + auVar68._4_4_;
                        fVar55 = auVar51._8_4_ + auVar46._8_4_ + auVar68._8_4_;
                        fVar57 = auVar51._12_4_ + auVar46._12_4_ + auVar68._12_4_;
                        fVar58 = auVar51._16_4_ + auVar46._16_4_ + auVar68._16_4_;
                        fVar59 = auVar51._20_4_ + auVar46._20_4_ + auVar68._20_4_;
                        fVar60 = auVar51._24_4_ + auVar46._24_4_ + auVar68._24_4_;
                        fVar61 = auVar51._28_4_ + auVar46._28_4_ + auVar68._28_4_;
                        fVar82 = auVar106._28_4_ + auVar52._28_4_ + auVar52._28_4_;
                        auVar99._0_4_ = fVar47 + pfVar22[-0x38] + fVar71 + fVar88 * 32.0;
                        auVar99._4_4_ = fVar53 + pfVar22[-0x37] + fVar72 + fVar89 * 32.0;
                        auVar99._8_4_ = fVar55 + pfVar22[-0x36] + fVar73 + fVar90 * 32.0;
                        auVar99._12_4_ = fVar57 + pfVar22[-0x35] + fVar74 + fVar91 * 32.0;
                        auVar107._16_4_ = fVar58 + pfVar22[-0x34] + fVar75 + fVar92 * 32.0;
                        auVar107._0_16_ = auVar99;
                        auVar107._20_4_ = fVar59 + pfVar22[-0x33] + fVar76 + fVar93 * 32.0;
                        auVar107._24_4_ = fVar60 + pfVar22[-0x32] + fVar83 + fVar94 * 32.0;
                        auVar107._28_4_ = fVar61 + pfVar22[-0x31] + fVar82;
                        fVar44 = auVar69._0_4_;
                        fVar43 = auVar69._4_4_;
                        fVar6 = auVar69._8_4_;
                        fVar7 = auVar69._12_4_;
                        fVar48 = auVar69._16_4_;
                        fVar54 = auVar69._20_4_;
                        fVar56 = auVar69._24_4_;
                        fVar110 = auVar124._0_4_;
                        fVar112 = auVar124._4_4_;
                        fVar114 = auVar124._8_4_;
                        fVar116 = auVar124._12_4_;
                        fVar118 = auVar124._16_4_;
                        fVar120 = auVar124._20_4_;
                        fVar121 = auVar124._24_4_;
                        fVar109 = auVar129._0_4_ + auVar46._0_4_;
                        fVar111 = auVar129._4_4_ + auVar46._4_4_;
                        fVar113 = auVar129._8_4_ + auVar46._8_4_;
                        fVar115 = auVar129._12_4_ + auVar46._12_4_;
                        fVar117 = auVar129._16_4_ + auVar46._16_4_;
                        fVar119 = auVar129._20_4_ + auVar46._20_4_;
                        fVar62 = auVar129._24_4_ + auVar46._24_4_;
                        fVar70 = auVar129._28_4_ + auVar46._28_4_;
                        fVar77 = auVar69._28_4_ + auVar69._28_4_ + fVar70;
                        auVar95._0_4_ = fVar44 + fVar44 + fVar109 + fVar110 * 16.0;
                        auVar95._4_4_ = fVar43 + fVar43 + fVar111 + fVar112 * 16.0;
                        auVar95._8_4_ = fVar6 + fVar6 + fVar113 + fVar114 * 16.0;
                        auVar95._12_4_ = fVar7 + fVar7 + fVar115 + fVar116 * 16.0;
                        auVar98._16_4_ = fVar48 + fVar48 + fVar117 + fVar118 * 16.0;
                        auVar98._0_16_ = auVar95;
                        auVar98._20_4_ = fVar54 + fVar54 + fVar119 + fVar120 * 16.0;
                        auVar98._24_4_ = fVar56 + fVar56 + fVar62 + fVar121 * 16.0;
                        auVar98._28_4_ = fVar77 + fVar82;
                        fVar77 = fVar77 + fVar61;
                        auVar84._0_4_ = fVar71 * 4.0 + fVar47 + fVar88 * 8.0;
                        auVar84._4_4_ = fVar72 * 4.0 + fVar53 + fVar89 * 8.0;
                        auVar84._8_4_ = fVar73 * 4.0 + fVar55 + fVar90 * 8.0;
                        auVar84._12_4_ = fVar74 * 4.0 + fVar57 + fVar91 * 8.0;
                        auVar87._16_4_ = fVar75 * 4.0 + fVar58 + fVar92 * 8.0;
                        auVar87._0_16_ = auVar84;
                        auVar87._20_4_ = fVar76 * 4.0 + fVar59 + fVar93 * 8.0;
                        auVar87._24_4_ = fVar83 * 4.0 + fVar60 + fVar94 * 8.0;
                        auVar87._28_4_ = fVar77 + fVar82;
                        fVar77 = fVar77 + fVar70;
                        auVar78._0_4_ = fVar44 * 8.0 + fVar109 + fVar110 * 4.0;
                        auVar78._4_4_ = fVar43 * 8.0 + fVar111 + fVar112 * 4.0;
                        auVar78._8_4_ = fVar6 * 8.0 + fVar113 + fVar114 * 4.0;
                        auVar78._12_4_ = fVar7 * 8.0 + fVar115 + fVar116 * 4.0;
                        auVar81._16_4_ = fVar48 * 8.0 + fVar117 + fVar118 * 4.0;
                        auVar81._0_16_ = auVar78;
                        auVar81._20_4_ = fVar54 * 8.0 + fVar119 + fVar120 * 4.0;
                        auVar81._24_4_ = fVar56 * 8.0 + fVar62 + fVar121 * 4.0;
                        auVar81._28_4_ = fVar77 + fVar82;
                        in_ZMM8 = ZEXT3264(CONCAT428(fVar108 + fVar108,
                                                     CONCAT424(fVar94 + fVar94,
                                                               CONCAT420(fVar93 + fVar93,
                                                                         CONCAT416(fVar92 + fVar92,
                                                                                   CONCAT412(fVar91 
                                                  + fVar91,CONCAT48(fVar90 + fVar90,
                                                                    CONCAT44(fVar89 + fVar89,
                                                                             fVar88 + fVar88))))))))
                        ;
                        fVar61 = fVar108 + fVar108 + fVar61;
                        auVar63._0_4_ = fVar71 * 16.0 + fVar88 + fVar88 + fVar47;
                        auVar63._4_4_ = fVar72 * 16.0 + fVar89 + fVar89 + fVar53;
                        auVar63._8_4_ = fVar73 * 16.0 + fVar90 + fVar90 + fVar55;
                        auVar63._12_4_ = fVar74 * 16.0 + fVar91 + fVar91 + fVar57;
                        auVar69._16_4_ = fVar75 * 16.0 + fVar92 + fVar92 + fVar58;
                        auVar69._0_16_ = auVar63;
                        auVar69._20_4_ = fVar76 * 16.0 + fVar93 + fVar93 + fVar59;
                        auVar69._24_4_ = fVar83 * 16.0 + fVar94 + fVar94 + fVar60;
                        auVar69._28_4_ = fVar77 + fVar61;
                        auVar45._0_4_ = fVar110 + fVar44 * 32.0 + fVar109 + *pfVar22;
                        auVar45._4_4_ = fVar112 + fVar43 * 32.0 + fVar111 + pfVar22[1];
                        auVar45._8_4_ = fVar114 + fVar6 * 32.0 + fVar113 + pfVar22[2];
                        auVar45._12_4_ = fVar116 + fVar7 * 32.0 + fVar115 + pfVar22[3];
                        auVar52._16_4_ = fVar118 + fVar48 * 32.0 + fVar117 + pfVar22[4];
                        auVar52._0_16_ = auVar45;
                        auVar52._20_4_ = fVar120 + fVar54 * 32.0 + fVar119 + pfVar22[5];
                        auVar52._24_4_ = fVar121 + fVar56 * 32.0 + fVar62 + pfVar22[6];
                        auVar52._28_4_ = auVar124._28_4_ + fVar61 + fVar70 + pfVar22[7];
                        auVar128 = auVar107._16_16_;
                        auVar125 = auVar98._16_16_;
                        auVar122 = auVar87._16_16_;
                        auVar100 = auVar81._16_16_;
                        auVar64 = auVar69._16_16_;
                        auVar49 = auVar52._16_16_;
                        if (iVar24 == 1) {
                          *(float *)*pauVar18 = auVar99._0_4_;
                          uVar3 = vextractps_avx(auVar99,1);
                          *(undefined4 *)(*pauVar18 + local_7e0 * 4) = uVar3;
                          uVar3 = vextractps_avx(auVar99,2);
                          *(undefined4 *)(*pauVar18 + lVar32 * 4) = uVar3;
                          uVar3 = vextractps_avx(auVar99,3);
                          *(undefined4 *)(*pauVar18 + lVar13 * 4) = uVar3;
                          *(float *)(*pauVar18 + lVar14 * 4) = auVar107._16_4_;
                          uVar3 = vextractps_avx(auVar128,1);
                          *(undefined4 *)(*pauVar18 + lVar15 * 4) = uVar3;
                          uVar3 = vextractps_avx(auVar128,2);
                          *(undefined4 *)(*pauVar18 + lVar16 * 4) = uVar3;
                          uVar3 = vextractps_avx(auVar128,3);
                          *(undefined4 *)(*pauVar18 + lVar17 * 4) = uVar3;
                          if (iVar30 < iVar10) {
                            *(float *)(*pauVar18 + 4) = auVar95._0_4_;
                            uVar3 = vextractps_avx(auVar95,1);
                            *(undefined4 *)(*pauVar18 + local_7e0 * 4 + 4) = uVar3;
                            uVar3 = vextractps_avx(auVar95,2);
                            *(undefined4 *)(*pauVar18 + lVar32 * 4 + 4) = uVar3;
                            uVar3 = vextractps_avx(auVar95,3);
                            *(undefined4 *)(*pauVar18 + lVar13 * 4 + 4) = uVar3;
                            *(float *)(*pauVar18 + lVar14 * 4 + 4) = auVar98._16_4_;
                            uVar3 = vextractps_avx(auVar125,1);
                            *(undefined4 *)(*pauVar18 + lVar15 * 4 + 4) = uVar3;
                            uVar3 = vextractps_avx(auVar125,2);
                            *(undefined4 *)(*pauVar18 + lVar16 * 4 + 4) = uVar3;
                            uVar3 = vextractps_avx(auVar125,3);
                            *(undefined4 *)(*pauVar18 + lVar17 * 4 + 4) = uVar3;
                          }
                          if (iVar27 < iVar10) {
                            *(float *)(*pauVar18 + 8) = auVar84._0_4_;
                            uVar3 = vextractps_avx(auVar84,1);
                            *(undefined4 *)(*pauVar18 + local_7e0 * 4 + 8) = uVar3;
                            uVar3 = vextractps_avx(auVar84,2);
                            *(undefined4 *)(*pauVar18 + lVar32 * 4 + 8) = uVar3;
                            uVar3 = vextractps_avx(auVar84,3);
                            *(undefined4 *)(*pauVar18 + lVar13 * 4 + 8) = uVar3;
                            *(float *)(*pauVar18 + lVar14 * 4 + 8) = auVar87._16_4_;
                            uVar3 = vextractps_avx(auVar122,1);
                            *(undefined4 *)(*pauVar18 + lVar15 * 4 + 8) = uVar3;
                            uVar3 = vextractps_avx(auVar122,2);
                            *(undefined4 *)(*pauVar18 + lVar16 * 4 + 8) = uVar3;
                            uVar3 = vextractps_avx(auVar122,3);
                            *(undefined4 *)(*pauVar18 + lVar17 * 4 + 8) = uVar3;
                          }
                          if (iVar36 < iVar10) {
                            *(float *)(*pauVar18 + 0xc) = auVar78._0_4_;
                            uVar3 = vextractps_avx(auVar78,1);
                            *(undefined4 *)(*pauVar18 + local_7e0 * 4 + 0xc) = uVar3;
                            uVar3 = vextractps_avx(auVar78,2);
                            *(undefined4 *)(*pauVar18 + lVar32 * 4 + 0xc) = uVar3;
                            uVar3 = vextractps_avx(auVar78,3);
                            *(undefined4 *)(*pauVar18 + lVar13 * 4 + 0xc) = uVar3;
                            *(float *)(*pauVar18 + lVar14 * 4 + 0xc) = auVar81._16_4_;
                            uVar3 = vextractps_avx(auVar100,1);
                            *(undefined4 *)(*pauVar18 + lVar15 * 4 + 0xc) = uVar3;
                            uVar3 = vextractps_avx(auVar100,2);
                            *(undefined4 *)(*pauVar18 + lVar16 * 4 + 0xc) = uVar3;
                            uVar3 = vextractps_avx(auVar100,3);
                            *(undefined4 *)(*pauVar18 + lVar17 * 4 + 0xc) = uVar3;
                          }
                          if (iVar37 < iVar10) {
                            *(float *)(*pauVar18 + 0x10) = auVar63._0_4_;
                            uVar3 = vextractps_avx(auVar63,1);
                            *(undefined4 *)(*pauVar18 + local_7e0 * 4 + 0x10) = uVar3;
                            uVar3 = vextractps_avx(auVar63,2);
                            *(undefined4 *)(*pauVar18 + lVar32 * 4 + 0x10) = uVar3;
                            uVar3 = vextractps_avx(auVar63,3);
                            *(undefined4 *)(*pauVar18 + lVar13 * 4 + 0x10) = uVar3;
                            *(float *)(*pauVar18 + lVar14 * 4 + 0x10) = auVar69._16_4_;
                            uVar3 = vextractps_avx(auVar64,1);
                            *(undefined4 *)(*pauVar18 + lVar15 * 4 + 0x10) = uVar3;
                            uVar3 = vextractps_avx(auVar64,2);
                            *(undefined4 *)(*pauVar18 + lVar16 * 4 + 0x10) = uVar3;
                            uVar3 = vextractps_avx(auVar64,3);
                            *(undefined4 *)(*pauVar18 + lVar17 * 4 + 0x10) = uVar3;
                          }
                          if (iVar39 < iVar10) {
                            *(float *)(*pauVar18 + 0x14) = auVar45._0_4_;
                            uVar3 = vextractps_avx(auVar45,1);
                            *(undefined4 *)(*pauVar18 + local_7e0 * 4 + 0x14) = uVar3;
                            uVar3 = vextractps_avx(auVar45,2);
                            *(undefined4 *)(*pauVar18 + lVar32 * 4 + 0x14) = uVar3;
                            uVar3 = vextractps_avx(auVar45,3);
                            *(undefined4 *)(*pauVar18 + lVar13 * 4 + 0x14) = uVar3;
                            *(float *)(*pauVar18 + lVar14 * 4 + 0x14) = auVar52._16_4_;
                            uVar3 = vextractps_avx(auVar49,1);
                            *(undefined4 *)(*pauVar18 + lVar15 * 4 + 0x14) = uVar3;
                            uVar3 = vextractps_avx(auVar49,2);
                            *(undefined4 *)(*pauVar18 + lVar16 * 4 + 0x14) = uVar3;
                            uVar3 = vextractps_avx(auVar49,3);
                            *(undefined4 *)(*pauVar18 + lVar17 * 4 + 0x14) = uVar3;
                          }
                        }
                        else if (iVar24 == 4) {
                          *(undefined1 (*) [16])*pauVar18 = auVar99;
                          *(undefined1 (*) [16])(*pauVar18 + local_7e0 * 4) = auVar128;
                          if (iVar30 < iVar10) {
                            *(undefined1 (*) [16])(*pauVar18 + 0x10) = auVar95;
                            *(undefined1 (*) [16])(*pauVar18 + local_7e0 * 4 + 0x10) = auVar125;
                          }
                          if (iVar27 < iVar10) {
                            *(undefined1 (*) [16])pauVar18[1] = auVar84;
                            *(undefined1 (*) [16])(pauVar18[1] + local_7e0 * 4) = auVar122;
                          }
                          if (iVar36 < iVar10) {
                            *(undefined1 (*) [16])(pauVar18[1] + 0x10) = auVar78;
                            *(undefined1 (*) [16])(pauVar18[1] + local_7e0 * 4 + 0x10) = auVar100;
                          }
                          if (iVar37 < iVar10) {
                            *(undefined1 (*) [16])pauVar18[2] = auVar63;
                            *(undefined1 (*) [16])(pauVar18[2] + local_7e0 * 4) = auVar64;
                          }
                          if (iVar39 < iVar10) {
                            *(undefined1 (*) [16])(pauVar18[2] + 0x10) = auVar45;
                            *(undefined1 (*) [16])(pauVar18[2] + local_7e0 * 4 + 0x10) = auVar49;
                          }
                        }
                        else if (iVar24 == 8) {
                          *pauVar18 = auVar107;
                          if (iVar30 < iVar10) {
                            pauVar18[1] = auVar98;
                          }
                          if (iVar27 < iVar10) {
                            pauVar18[2] = auVar87;
                          }
                          if (iVar36 < iVar10) {
                            pauVar18[3] = auVar81;
                          }
                          if (iVar37 < iVar10) {
                            pauVar18[4] = auVar69;
                          }
                          if (iVar39 < iVar10) {
                            pauVar18[5] = auVar52;
                          }
                        }
                        pauVar18 = (undefined1 (*) [32])(*pauVar18 + (long)(iVar24 * iVar10) * 4);
                      }
                      lVar26 = lVar26 + 1;
                      pfVar22 = pfVar22 + 0x40;
                    } while (lVar26 != 6);
                    pfVar21 = pfVar21 + 8;
                    pvVar20 = (void *)((long)local_7d0 + 1U);
                  } while ((void *)((long)local_7d0 + 1U) != pvVar28);
                }
                uVar29 = local_6d8 + 8;
                local_740 = (ulong)(uint)((int)local_740 + local_724);
                local_730 = pvVar28;
              } while (local_6d8 + 0xf < local_668);
            }
            if ((int)((uint)uVar29 | 3) < (int)uVar40) {
              local_7d0 = (void *)(long)(int)(uVar25 * 2);
              lVar13 = (long)(int)(uVar25 * 3);
              iVar27 = (uint)uVar29 * uVar41 * 0x40;
              local_7e0 = CONCAT44(local_7e0._4_4_,uVar41 * 0x100);
              local_7e8 = (void *)((long)local_7f0 + local_808 * 4);
              lVar14 = (long)(int)uVar25;
              local_850 = uVar29 & 0xffffffff;
              do {
                if (local_7f0 == (void *)0x0) {
                  auVar45 = ZEXT816(0) << 0x40;
                }
                else {
                  auVar45 = *(undefined1 (*) [16])((long)local_7e8 + local_850 * 4);
                }
                if (0 < (int)uVar41) {
                  pfVar21 = (float *)((long)&local_7f8->data + (long)iVar27 * 4);
                  pvVar20 = (void *)0x0;
                  do {
                    iVar36 = (int)pvVar20 + iVar11;
                    lVar15 = -0x80;
                    pfVar22 = pfVar21;
                    do {
                      auVar49 = *(undefined1 (*) [16])(pfVar22 + (int)(uVar41 * 4));
                      auVar63 = *(undefined1 (*) [16])(pfVar22 + (int)(uVar41 * 8));
                      auVar64 = *(undefined1 (*) [16])(pfVar22 + (int)(uVar41 * 0xc));
                      auVar78 = *(undefined1 (*) [16])(pfVar22 + (int)(uVar41 << 4));
                      auVar100 = *(undefined1 (*) [16])(pfVar22 + (int)(uVar41 * 0x14));
                      auVar84 = *(undefined1 (*) [16])(pfVar22 + (int)(uVar41 * 0x18));
                      fVar115 = auVar63._0_4_ + auVar49._0_4_;
                      fVar117 = auVar63._4_4_ + auVar49._4_4_;
                      fVar119 = auVar63._8_4_ + auVar49._8_4_;
                      fVar62 = auVar63._12_4_ + auVar49._12_4_;
                      auVar49 = vsubps_avx(auVar49,auVar63);
                      fVar59 = auVar78._0_4_ + auVar64._0_4_;
                      fVar60 = auVar78._4_4_ + auVar64._4_4_;
                      fVar61 = auVar78._8_4_ + auVar64._8_4_;
                      fVar77 = auVar78._12_4_ + auVar64._12_4_;
                      auVar63 = vsubps_avx(auVar64,auVar78);
                      fVar82 = auVar84._0_4_ + auVar100._0_4_;
                      fVar109 = auVar84._4_4_ + auVar100._4_4_;
                      fVar111 = auVar84._8_4_ + auVar100._8_4_;
                      fVar113 = auVar84._12_4_ + auVar100._12_4_;
                      auVar64 = vsubps_avx(auVar100,auVar84);
                      auVar100._0_4_ = fVar82 * 32.0 + fVar59 + fVar115 + *pfVar22;
                      auVar100._4_4_ = fVar109 * 32.0 + fVar60 + fVar117 + pfVar22[1];
                      auVar100._8_4_ = fVar111 * 32.0 + fVar61 + fVar119 + pfVar22[2];
                      auVar100._12_4_ = fVar113 * 32.0 + fVar77 + fVar62 + pfVar22[3];
                      fVar44 = auVar63._0_4_;
                      fVar6 = auVar63._4_4_;
                      fVar48 = auVar63._8_4_;
                      fVar56 = auVar63._12_4_;
                      fVar43 = auVar49._0_4_;
                      fVar7 = auVar49._4_4_;
                      fVar54 = auVar49._8_4_;
                      fVar47 = auVar49._12_4_;
                      fVar53 = auVar64._0_4_;
                      fVar55 = auVar64._4_4_;
                      fVar57 = auVar64._8_4_;
                      fVar58 = auVar64._12_4_;
                      auVar122._0_4_ = fVar44 + fVar44 + fVar43 + fVar53 * 16.0;
                      auVar122._4_4_ = fVar6 + fVar6 + fVar7 + fVar55 * 16.0;
                      auVar122._8_4_ = fVar48 + fVar48 + fVar54 + fVar57 * 16.0;
                      auVar122._12_4_ = fVar56 + fVar56 + fVar47 + fVar58 * 16.0;
                      in_ZMM8 = ZEXT1664(auVar122);
                      auVar125._0_4_ = fVar59 * 4.0 + fVar115 + fVar82 * 8.0;
                      auVar125._4_4_ = fVar60 * 4.0 + fVar117 + fVar109 * 8.0;
                      auVar125._8_4_ = fVar61 * 4.0 + fVar119 + fVar111 * 8.0;
                      auVar125._12_4_ = fVar77 * 4.0 + fVar62 + fVar113 * 8.0;
                      in_ZMM9 = ZEXT1664(auVar125);
                      auVar128._0_4_ = fVar44 * 8.0 + fVar43 + fVar53 * 4.0;
                      auVar128._4_4_ = fVar6 * 8.0 + fVar7 + fVar55 * 4.0;
                      auVar128._8_4_ = fVar48 * 8.0 + fVar54 + fVar57 * 4.0;
                      auVar128._12_4_ = fVar56 * 8.0 + fVar47 + fVar58 * 4.0;
                      in_ZMM10 = ZEXT1664(auVar128);
                      auVar64._0_4_ = fVar59 * 16.0 + fVar115 + fVar82 + fVar82;
                      auVar64._4_4_ = fVar60 * 16.0 + fVar117 + fVar109 + fVar109;
                      auVar64._8_4_ = fVar61 * 16.0 + fVar119 + fVar111 + fVar111;
                      auVar64._12_4_ = fVar77 * 16.0 + fVar62 + fVar113 + fVar113;
                      pfVar38 = pfVar22 + (int)(uVar41 * 0x1c);
                      auVar49._0_4_ = fVar44 * 32.0 + fVar43 + *pfVar38 + fVar53;
                      auVar49._4_4_ = fVar6 * 32.0 + fVar7 + pfVar38[1] + fVar55;
                      auVar49._8_4_ = fVar48 * 32.0 + fVar54 + pfVar38[2] + fVar57;
                      auVar49._12_4_ = fVar56 * 32.0 + fVar47 + pfVar38[3] + fVar58;
                      *(undefined1 (*) [16])((long)local_5e0 + lVar15) = auVar100;
                      *(undefined1 (*) [16])((long)auStack_560 + lVar15) = auVar122;
                      *(undefined1 (*) [16])((long)auStack_4e0 + lVar15) = auVar125;
                      *(undefined1 (*) [16])(auStack_460 + lVar15) = auVar128;
                      *(undefined1 (*) [16])(auStack_3e0 + lVar15) = auVar64;
                      *(undefined1 (*) [16])(auStack_360 + lVar15) = auVar49;
                      pfVar22 = pfVar22 + (int)(uVar41 << 5);
                      lVar15 = lVar15 + 0x10;
                    } while (lVar15 != 0);
                    iVar30 = iVar36 % (int)uVar42;
                    lVar15 = (long)((iVar36 / (int)uVar42) * 6);
                    pauVar19 = (undefined1 (*) [16])
                               ((long)local_7c8->data +
                               (long)(iVar30 * 6 * iVar24) * 4 +
                               (long)local_7c8->w * local_7c8->elemsize * lVar15 +
                               local_7c8->cstep * (long)(((int)local_748 + (int)local_850) / iVar24)
                               * local_7c8->elemsize);
                    iVar31 = iVar30 * 6 + 1;
                    iVar36 = iVar30 * 6 + 2;
                    iVar37 = iVar30 * 6 + 3;
                    iVar39 = iVar30 * 6 + 4;
                    iVar30 = iVar30 * 6 + 5;
                    pfVar22 = local_600 + 4;
                    lVar16 = 0;
                    do {
                      if (lVar16 < local_7b0 - lVar15) {
                        auVar49 = *(undefined1 (*) [16])(pfVar22 + -0x18);
                        auVar63 = *(undefined1 (*) [16])(pfVar22 + -0x14);
                        auVar64 = *(undefined1 (*) [16])(pfVar22 + -0x10);
                        auVar78 = *(undefined1 (*) [16])(pfVar22 + -0xc);
                        auVar100 = *(undefined1 (*) [16])(pfVar22 + -8);
                        auVar84 = *(undefined1 (*) [16])(pfVar22 + -4);
                        auVar122 = vsubps_avx(auVar49,auVar63);
                        fVar59 = auVar78._0_4_ + auVar64._0_4_;
                        fVar60 = auVar78._4_4_ + auVar64._4_4_;
                        fVar61 = auVar78._8_4_ + auVar64._8_4_;
                        fVar77 = auVar78._12_4_ + auVar64._12_4_;
                        auVar64 = vsubps_avx(auVar64,auVar78);
                        in_ZMM9 = ZEXT1664(auVar64);
                        fVar82 = auVar84._0_4_ + auVar100._0_4_;
                        fVar109 = auVar84._4_4_ + auVar100._4_4_;
                        fVar111 = auVar84._8_4_ + auVar100._8_4_;
                        fVar113 = auVar84._12_4_ + auVar100._12_4_;
                        in_ZMM10 = ZEXT1664(CONCAT412(fVar113,CONCAT48(fVar111,CONCAT44(fVar109,
                                                  fVar82))));
                        auVar78 = vsubps_avx(auVar100,auVar84);
                        fVar48 = auVar49._0_4_ + auVar45._0_4_ + auVar63._0_4_;
                        fVar54 = auVar49._4_4_ + auVar45._4_4_ + auVar63._4_4_;
                        fVar56 = auVar49._8_4_ + auVar45._8_4_ + auVar63._8_4_;
                        fVar47 = auVar49._12_4_ + auVar45._12_4_ + auVar63._12_4_;
                        auVar101._0_4_ = fVar48 + pfVar22[-0x1c] + fVar59 + fVar82 * 32.0;
                        auVar101._4_4_ = fVar54 + pfVar22[-0x1b] + fVar60 + fVar109 * 32.0;
                        auVar101._8_4_ = fVar56 + pfVar22[-0x1a] + fVar61 + fVar111 * 32.0;
                        auVar101._12_4_ = fVar47 + pfVar22[-0x19] + fVar77 + fVar113 * 32.0;
                        fVar44 = auVar64._0_4_;
                        fVar43 = auVar64._4_4_;
                        fVar6 = auVar64._8_4_;
                        fVar7 = auVar64._12_4_;
                        fVar115 = auVar78._0_4_;
                        fVar117 = auVar78._4_4_;
                        fVar119 = auVar78._8_4_;
                        fVar62 = auVar78._12_4_;
                        fVar53 = auVar122._0_4_ + auVar45._0_4_;
                        fVar55 = auVar122._4_4_ + auVar45._4_4_;
                        fVar57 = auVar122._8_4_ + auVar45._8_4_;
                        fVar58 = auVar122._12_4_ + auVar45._12_4_;
                        auVar96._0_4_ = fVar44 + fVar44 + fVar53 + fVar115 * 16.0;
                        auVar96._4_4_ = fVar43 + fVar43 + fVar55 + fVar117 * 16.0;
                        auVar96._8_4_ = fVar6 + fVar6 + fVar57 + fVar119 * 16.0;
                        auVar96._12_4_ = fVar7 + fVar7 + fVar58 + fVar62 * 16.0;
                        auVar85._0_4_ = fVar59 * 4.0 + fVar48 + fVar82 * 8.0;
                        auVar85._4_4_ = fVar60 * 4.0 + fVar54 + fVar109 * 8.0;
                        auVar85._8_4_ = fVar61 * 4.0 + fVar56 + fVar111 * 8.0;
                        auVar85._12_4_ = fVar77 * 4.0 + fVar47 + fVar113 * 8.0;
                        auVar79._0_4_ = fVar44 * 8.0 + fVar53 + fVar115 * 4.0;
                        auVar79._4_4_ = fVar43 * 8.0 + fVar55 + fVar117 * 4.0;
                        auVar79._8_4_ = fVar6 * 8.0 + fVar57 + fVar119 * 4.0;
                        auVar79._12_4_ = fVar7 * 8.0 + fVar58 + fVar62 * 4.0;
                        in_ZMM8 = ZEXT1664(CONCAT412(fVar113 + fVar113,
                                                     CONCAT48(fVar111 + fVar111,
                                                              CONCAT44(fVar109 + fVar109,
                                                                       fVar82 + fVar82))));
                        auVar65._0_4_ = fVar59 * 16.0 + fVar82 + fVar82 + fVar48;
                        auVar65._4_4_ = fVar60 * 16.0 + fVar109 + fVar109 + fVar54;
                        auVar65._8_4_ = fVar61 * 16.0 + fVar111 + fVar111 + fVar56;
                        auVar65._12_4_ = fVar77 * 16.0 + fVar113 + fVar113 + fVar47;
                        auVar50._0_4_ = fVar115 + fVar44 * 32.0 + fVar53 + *pfVar22;
                        auVar50._4_4_ = fVar117 + fVar43 * 32.0 + fVar55 + pfVar22[1];
                        auVar50._8_4_ = fVar119 + fVar6 * 32.0 + fVar57 + pfVar22[2];
                        auVar50._12_4_ = fVar62 + fVar7 * 32.0 + fVar58 + pfVar22[3];
                        if (iVar24 == 1) {
                          *(float *)*pauVar19 = auVar101._0_4_;
                          uVar3 = vextractps_avx(auVar101,1);
                          *(undefined4 *)(*pauVar19 + lVar14 * 4) = uVar3;
                          uVar3 = vextractps_avx(auVar101,2);
                          *(undefined4 *)(*pauVar19 + (long)local_7d0 * 4) = uVar3;
                          uVar3 = vextractps_avx(auVar101,3);
                          *(undefined4 *)(*pauVar19 + lVar13 * 4) = uVar3;
                          if (iVar31 < iVar10) {
                            *(float *)(*pauVar19 + 4) = auVar96._0_4_;
                            uVar3 = vextractps_avx(auVar96,1);
                            *(undefined4 *)(*pauVar19 + lVar14 * 4 + 4) = uVar3;
                            uVar3 = vextractps_avx(auVar96,2);
                            *(undefined4 *)(*pauVar19 + (long)local_7d0 * 4 + 4) = uVar3;
                            uVar3 = vextractps_avx(auVar96,3);
                            *(undefined4 *)(*pauVar19 + lVar13 * 4 + 4) = uVar3;
                          }
                          if (iVar36 < iVar10) {
                            *(float *)(*pauVar19 + 8) = auVar85._0_4_;
                            uVar3 = vextractps_avx(auVar85,1);
                            *(undefined4 *)(*pauVar19 + lVar14 * 4 + 8) = uVar3;
                            uVar3 = vextractps_avx(auVar85,2);
                            *(undefined4 *)(*pauVar19 + (long)local_7d0 * 4 + 8) = uVar3;
                            uVar3 = vextractps_avx(auVar85,3);
                            *(undefined4 *)(*pauVar19 + lVar13 * 4 + 8) = uVar3;
                          }
                          if (iVar37 < iVar10) {
                            *(float *)(*pauVar19 + 0xc) = auVar79._0_4_;
                            uVar3 = vextractps_avx(auVar79,1);
                            *(undefined4 *)(*pauVar19 + lVar14 * 4 + 0xc) = uVar3;
                            uVar3 = vextractps_avx(auVar79,2);
                            *(undefined4 *)(*pauVar19 + (long)local_7d0 * 4 + 0xc) = uVar3;
                            uVar3 = vextractps_avx(auVar79,3);
                            *(undefined4 *)(*pauVar19 + lVar13 * 4 + 0xc) = uVar3;
                          }
                          if (iVar39 < iVar10) {
                            *(float *)pauVar19[1] = auVar65._0_4_;
                            uVar3 = vextractps_avx(auVar65,1);
                            *(undefined4 *)(pauVar19[1] + lVar14 * 4) = uVar3;
                            uVar3 = vextractps_avx(auVar65,2);
                            *(undefined4 *)(pauVar19[1] + (long)local_7d0 * 4) = uVar3;
                            uVar3 = vextractps_avx(auVar65,3);
                            *(undefined4 *)(pauVar19[1] + lVar13 * 4) = uVar3;
                          }
                          if (iVar30 < iVar10) {
                            *(float *)(pauVar19[1] + 4) = auVar50._0_4_;
                            uVar3 = vextractps_avx(auVar50,1);
                            *(undefined4 *)(pauVar19[1] + lVar14 * 4 + 4) = uVar3;
                            uVar3 = vextractps_avx(auVar50,2);
                            *(undefined4 *)(pauVar19[1] + (long)local_7d0 * 4 + 4) = uVar3;
                            uVar3 = vextractps_avx(auVar50,3);
                            *(undefined4 *)(pauVar19[1] + lVar13 * 4 + 4) = uVar3;
                          }
                        }
                        else if (iVar24 == 4) {
                          *pauVar19 = auVar101;
                          if (iVar31 < iVar10) {
                            pauVar19[1] = auVar96;
                          }
                          if (iVar36 < iVar10) {
                            pauVar19[2] = auVar85;
                          }
                          if (iVar37 < iVar10) {
                            pauVar19[3] = auVar79;
                          }
                          if (iVar39 < iVar10) {
                            pauVar19[4] = auVar65;
                          }
                          if (iVar30 < iVar10) {
                            pauVar19[5] = auVar50;
                          }
                        }
                        pauVar19 = (undefined1 (*) [16])(*pauVar19 + (long)(iVar24 * iVar10) * 4);
                      }
                      lVar16 = lVar16 + 1;
                      pfVar22 = pfVar22 + 0x20;
                    } while (lVar16 != 6);
                    pvVar20 = (void *)((long)pvVar20 + 1);
                    pfVar21 = pfVar21 + 4;
                  } while (pvVar20 != pvVar28);
                }
                uVar29 = local_850 + 4;
                lVar15 = local_850 + 7;
                iVar27 = iVar27 + uVar41 * 0x100;
                local_850 = uVar29;
              } while (lVar15 < local_738);
              uVar29 = uVar29 & 0xffffffff;
              local_7d8 = pvVar28;
            }
            auVar132 = ZEXT1664(CONCAT412(0x41800000,CONCAT48(0x41800000,0x4180000041800000)));
            uVar12 = (uint)uVar29;
            if ((int)(uVar12 | 1) < (int)uVar40) {
              local_7e8 = (void *)(local_7c8->cstep * local_7c8->elemsize);
              local_7d0 = (void *)((long)local_7c8->w * local_7c8->elemsize);
              iVar24 = uVar12 * uVar41 * 0x40;
              local_7e0 = CONCAT44(local_7e0._4_4_,uVar41 * 0x80);
              local_730 = local_7c8->data;
              local_850 = uVar29 & 0xffffffff;
              do {
                if (local_7f0 == (void *)0x0) {
                  fVar43 = 0.0;
                  fVar44 = 0.0;
                }
                else {
                  fVar44 = *(float *)((long)local_7f0 + (local_808 + local_850) * 4);
                  fVar43 = *(float *)((long)local_7f0 + (local_808 + local_850) * 4 + 4);
                }
                if (0 < (int)uVar41) {
                  puVar33 = (undefined8 *)((long)&local_7f8->data + (long)iVar24 * 4);
                  pvVar20 = (void *)0x0;
                  do {
                    iVar27 = (int)pvVar20 + iVar11;
                    lVar13 = -0x40;
                    puVar34 = puVar33;
                    do {
                      uVar29 = *(ulong *)((long)puVar34 + (long)(int)(uVar41 * 2) * 4);
                      auVar80._8_8_ = 0;
                      auVar80._0_8_ = uVar29;
                      uVar1 = *(ulong *)((long)puVar34 + (long)(int)(uVar41 * 4) * 4);
                      auVar86._8_8_ = 0;
                      auVar86._0_8_ = uVar1;
                      fVar61 = (float)uVar1 + (float)uVar29;
                      fVar77 = (float)(uVar1 >> 0x20) + (float)(uVar29 >> 0x20);
                      uVar29 = *(ulong *)((long)puVar34 + (long)(int)(uVar41 * 6) * 4);
                      auVar97._8_8_ = 0;
                      auVar97._0_8_ = uVar29;
                      uVar1 = *(ulong *)((long)puVar34 + (long)(int)(uVar41 * 8) * 4);
                      auVar102._8_8_ = 0;
                      auVar102._0_8_ = uVar1;
                      fVar82 = (float)uVar1 + (float)uVar29;
                      fVar109 = (float)(uVar1 >> 0x20) + (float)(uVar29 >> 0x20);
                      uVar29 = *(ulong *)((long)puVar34 + (long)(int)(uVar41 * 10) * 4);
                      auVar123._8_8_ = 0;
                      auVar123._0_8_ = uVar29;
                      uVar1 = *(ulong *)((long)puVar34 + (long)(int)(uVar41 * 0xc) * 4);
                      auVar126._8_8_ = 0;
                      auVar126._0_8_ = uVar1;
                      in_ZMM9 = ZEXT1664(auVar126);
                      fVar111 = (float)uVar1 + (float)uVar29;
                      fVar113 = (float)(uVar1 >> 0x20) + (float)(uVar29 >> 0x20);
                      in_ZMM10 = ZEXT864(CONCAT44(fVar113,fVar111));
                      auVar130._0_4_ = fVar82 + fVar61 + (float)*puVar34 + fVar111 * 32.0;
                      auVar130._4_4_ =
                           fVar109 + fVar77 + (float)((ulong)*puVar34 >> 0x20) + fVar113 * 32.0;
                      auVar130._8_8_ = 0;
                      uVar2 = vmovlps_avx(auVar130);
                      *(undefined8 *)((long)local_620 + lVar13) = uVar2;
                      auVar45 = vsubps_avx(auVar80,auVar86);
                      auVar49 = vsubps_avx(auVar97,auVar102);
                      auVar63 = vsubps_avx(auVar123,auVar126);
                      fVar57 = auVar63._0_4_;
                      fVar58 = auVar63._4_4_;
                      fVar59 = auVar63._8_4_;
                      fVar60 = auVar63._12_4_;
                      fVar6 = auVar49._0_4_;
                      fVar48 = auVar49._4_4_;
                      fVar56 = auVar49._8_4_;
                      fVar53 = auVar49._12_4_;
                      fVar7 = auVar45._0_4_;
                      fVar54 = auVar45._4_4_;
                      fVar47 = auVar45._8_4_;
                      fVar55 = auVar45._12_4_;
                      auVar103._0_4_ = fVar6 + fVar6 + fVar7 + auVar132._0_4_ * fVar57;
                      auVar103._4_4_ = fVar48 + fVar48 + fVar54 + auVar132._4_4_ * fVar58;
                      auVar103._8_4_ = fVar56 + fVar56 + fVar47 + auVar132._8_4_ * fVar59;
                      auVar103._12_4_ = fVar53 + fVar53 + fVar55 + auVar132._12_4_ * fVar60;
                      uVar2 = vmovlps_avx(auVar103);
                      *(undefined8 *)((long)local_5e0 + lVar13) = uVar2;
                      auVar104._0_4_ = fVar111 * 8.0 + fVar82 * 4.0 + fVar61;
                      auVar104._4_4_ = fVar113 * 8.0 + fVar109 * 4.0 + fVar77;
                      auVar104._8_8_ = 0;
                      uVar2 = vmovlps_avx(auVar104);
                      *(undefined8 *)((long)local_5a0 + lVar13) = uVar2;
                      in_ZMM8 = ZEXT1664(CONCAT412(fVar60 * 4.0,
                                                   CONCAT48(fVar59 * 4.0,
                                                            CONCAT44(fVar58 * 4.0,fVar57 * 4.0))));
                      auVar105._0_4_ = fVar57 * 4.0 + fVar6 * 8.0 + fVar7;
                      auVar105._4_4_ = fVar58 * 4.0 + fVar48 * 8.0 + fVar54;
                      auVar105._8_4_ = fVar59 * 4.0 + fVar56 * 8.0 + fVar47;
                      auVar105._12_4_ = fVar60 * 4.0 + fVar53 * 8.0 + fVar55;
                      uVar2 = vmovlps_avx(auVar105);
                      *(undefined8 *)((long)auStack_560 + lVar13) = uVar2;
                      auVar66._0_4_ = auVar132._0_4_ * fVar82 + fVar61 + fVar111 + fVar111;
                      auVar66._4_4_ = auVar132._4_4_ * fVar109 + fVar77 + fVar113 + fVar113;
                      auVar66._8_4_ = auVar132._8_4_ * 0.0 + 0.0;
                      auVar66._12_4_ = auVar132._12_4_ * 0.0 + 0.0;
                      uVar2 = vmovlps_avx(auVar66);
                      *(undefined8 *)((long)auStack_520 + lVar13) = uVar2;
                      uVar2 = *(undefined8 *)((long)puVar34 + (long)(int)(uVar41 * 0xe) * 4);
                      auVar67._0_4_ = fVar6 * 32.0 + fVar7 + fVar57 + (float)uVar2;
                      auVar67._4_4_ =
                           fVar48 * 32.0 + fVar54 + fVar58 + (float)((ulong)uVar2 >> 0x20);
                      auVar67._8_4_ = fVar56 * 32.0 + fVar47 + fVar59 + 0.0;
                      auVar67._12_4_ = fVar53 * 32.0 + fVar55 + fVar60 + 0.0;
                      uVar2 = vmovlps_avx(auVar67);
                      *(undefined8 *)((long)auStack_4e0 + lVar13) = uVar2;
                      puVar34 = (undefined8 *)((long)puVar34 + (long)(int)(uVar41 * 0x10) * 4);
                      lVar13 = lVar13 + 8;
                    } while (lVar13 != 0);
                    iVar36 = iVar27 % (int)uVar42;
                    lVar13 = (long)((iVar27 / (int)uVar42) * 6);
                    pfVar21 = (float *)((long)local_730 +
                                       (long)(iVar36 * 6) * 4 +
                                       (long)local_7d0 * lVar13 +
                                       (local_808 + local_850) * (long)local_7e8);
                    pfVar22 = &fStack_624;
                    lVar14 = 0;
                    do {
                      if (lVar14 < local_7b0 - lVar13) {
                        fVar54 = pfVar22[-7] + pfVar22[-9];
                        fVar56 = pfVar22[-6] + pfVar22[-8];
                        fVar60 = pfVar22[-9] - pfVar22[-7];
                        fVar61 = pfVar22[-8] - pfVar22[-6];
                        fVar47 = pfVar22[-3] + pfVar22[-5];
                        fVar53 = pfVar22[-4] + pfVar22[-2];
                        fVar77 = pfVar22[-5] - pfVar22[-3];
                        fVar82 = pfVar22[-4] - pfVar22[-2];
                        fVar55 = pfVar22[-0xb] + fVar44 + pfVar22[-0xd];
                        fVar57 = pfVar22[-10] + fVar43 + pfVar22[-0xc];
                        fVar58 = fVar44 + (pfVar22[-0xd] - pfVar22[-0xb]);
                        fVar59 = fVar43 + (pfVar22[-0xc] - pfVar22[-10]);
                        in_ZMM10 = ZEXT464((uint)fVar56);
                        fVar6 = pfVar22[-1];
                        fVar7 = *pfVar22;
                        fVar48 = pfVar22[-0xe];
                        *pfVar21 = fVar55 + pfVar22[-0xf] + fVar54 + fVar47 * 32.0;
                        pfVar21[(int)uVar25] = fVar56 + fVar53 * 32.0 + fVar57 + fVar48;
                        if (iVar36 * 6 + 1 < iVar10) {
                          pfVar21[1] = fVar60 + fVar60 + fVar58 + fVar77 * 16.0;
                          pfVar21[(long)(int)uVar25 + 1] = fVar59 + fVar61 + fVar61 + fVar82 * 16.0;
                        }
                        if (iVar36 * 6 + 2 < iVar10) {
                          pfVar21[2] = fVar54 * 4.0 + fVar55 + fVar47 * 8.0;
                          pfVar21[(long)(int)uVar25 + 2] = fVar53 * 8.0 + fVar56 * 4.0 + fVar57;
                        }
                        in_ZMM9 = ZEXT464(0);
                        if (iVar36 * 6 + 3 < iVar10) {
                          in_ZMM9 = ZEXT464(0x41000000);
                          pfVar21[3] = fVar58 + fVar60 * 8.0 + fVar77 * 4.0;
                          pfVar21[(long)(int)uVar25 + 3] = fVar82 * 4.0 + fVar59 + fVar61 * 8.0;
                        }
                        in_ZMM8 = ZEXT464(0);
                        if (iVar36 * 6 + 4 < iVar10) {
                          pfVar21[4] = fVar54 * 16.0 + fVar55 + fVar47 + fVar47;
                          pfVar21[(long)(int)uVar25 + 4] = fVar56 * 16.0 + fVar57 + fVar53 + fVar53;
                        }
                        auVar132 = ZEXT1664(CONCAT412(0x41800000,
                                                      CONCAT48(0x41800000,0x4180000041800000)));
                        if (iVar36 * 6 + 5 < iVar10) {
                          pfVar21[5] = fVar60 * 32.0 + fVar58 + fVar77 + fVar6;
                          pfVar21[(long)(int)uVar25 + 5] = fVar59 + fVar82 + fVar61 * 32.0 + fVar7;
                        }
                        pfVar21 = pfVar21 + iVar10;
                      }
                      lVar14 = lVar14 + 1;
                      pfVar22 = pfVar22 + 0x10;
                    } while (lVar14 != 6);
                    pvVar20 = (void *)((long)pvVar20 + 1);
                    puVar33 = puVar33 + 1;
                  } while (pvVar20 != pvVar28);
                }
                uVar29 = local_850 + 2;
                lVar13 = local_850 + 3;
                iVar24 = iVar24 + uVar41 * 0x80;
                local_850 = uVar29;
              } while (lVar13 < local_738);
              uVar12 = (uint)uVar29;
              local_7d8 = pvVar28;
            }
            in_ZMM11 = ZEXT464(0x42000000);
            if ((int)uVar12 < (int)uVar40) {
              iVar24 = local_7c8->w;
              pvVar20 = local_7c8->data;
              sVar4 = local_7c8->elemsize;
              sVar5 = local_7c8->cstep;
              local_888 = (long)(int)uVar12;
              iVar27 = uVar12 * uVar41 * 0x40;
              do {
                if (local_7f0 == (void *)0x0) {
                  fVar44 = 0.0;
                }
                else {
                  fVar44 = *(float *)((long)local_7f0 + local_888 * 4 + local_808 * 4);
                }
                if (0 < (int)uVar41) {
                  pfVar21 = (float *)((long)&local_7f8->data + (long)iVar27 * 4);
                  pvVar23 = (void *)0x0;
                  do {
                    iVar36 = (int)pvVar23 + iVar11;
                    lVar13 = -0x20;
                    pfVar22 = pfVar21;
                    do {
                      fVar43 = pfVar22[(int)(uVar41 * 2)] + pfVar22[(int)uVar41];
                      fVar48 = pfVar22[(int)uVar41] - pfVar22[(int)(uVar41 * 2)];
                      fVar6 = pfVar22[(int)(uVar41 * 4)] + pfVar22[(int)(uVar41 * 3)];
                      fVar54 = pfVar22[(int)(uVar41 * 3)] - pfVar22[(int)(uVar41 * 4)];
                      fVar7 = pfVar22[(int)(uVar41 * 6)] + pfVar22[(int)(uVar41 * 5)];
                      fVar56 = pfVar22[(int)(uVar41 * 5)] - pfVar22[(int)(uVar41 * 6)];
                      *(float *)((long)&local_640 + lVar13) =
                           fVar7 * 32.0 + fVar6 + fVar43 + *pfVar22;
                      *(float *)((long)local_620 + lVar13) =
                           fVar54 + fVar54 + fVar48 + fVar56 * 16.0;
                      *(float *)((long)local_600 + lVar13) = fVar7 * 8.0 + fVar6 * 4.0 + fVar43;
                      in_ZMM8 = ZEXT464((uint)(fVar56 * 4.0));
                      *(float *)((long)local_5e0 + lVar13) = fVar56 * 4.0 + fVar54 * 8.0 + fVar48;
                      *(float *)((long)local_5c0 + lVar13) = fVar6 * 16.0 + fVar43 + fVar7 + fVar7;
                      *(float *)((long)local_5a0 + lVar13) =
                           fVar54 * 32.0 + fVar48 + fVar56 + pfVar22[(int)(uVar41 * 7)];
                      pfVar22 = pfVar22 + (int)(uVar41 * 8);
                      lVar13 = lVar13 + 4;
                    } while (lVar13 != 0);
                    iVar37 = iVar36 % (int)uVar42;
                    lVar13 = (long)((iVar36 / (int)uVar42) * 6);
                    pfVar22 = (float *)((long)pvVar20 +
                                       (long)(iVar37 * 6) * 4 +
                                       (long)iVar24 * sVar4 * lVar13 +
                                       (local_808 + local_888) * sVar5 * sVar4);
                    pfVar38 = afStack_658 + 5;
                    lVar14 = 0;
                    do {
                      if (lVar14 < local_7b0 - lVar13) {
                        fVar6 = pfVar38[-3] + pfVar38[-4];
                        fVar56 = pfVar38[-4] - pfVar38[-3];
                        fVar7 = pfVar38[-1] + pfVar38[-2];
                        fVar47 = pfVar38[-2] - pfVar38[-1];
                        fVar48 = pfVar38[-6] + fVar44 + pfVar38[-5];
                        fVar54 = (pfVar38[-6] - pfVar38[-5]) + fVar44;
                        fVar43 = *pfVar38;
                        *pfVar22 = fVar48 + pfVar38[-7] + fVar6 + fVar7 * 32.0;
                        if (iVar37 * 6 + 1 < iVar10) {
                          pfVar22[1] = fVar56 + fVar56 + fVar54 + fVar47 * 16.0;
                        }
                        in_ZMM10 = ZEXT464(0);
                        if (iVar37 * 6 + 2 < iVar10) {
                          pfVar22[2] = fVar6 * 4.0 + fVar48 + fVar7 * 8.0;
                        }
                        in_ZMM9 = ZEXT464(0);
                        in_ZMM8 = ZEXT464(0);
                        if (iVar37 * 6 + 3 < iVar10) {
                          pfVar22[3] = fVar56 * 8.0 + fVar54 + fVar47 * 4.0;
                        }
                        if (iVar37 * 6 + 4 < iVar10) {
                          pfVar22[4] = fVar6 * 16.0 + fVar48 + fVar7 + fVar7;
                        }
                        if (iVar37 * 6 + 5 < iVar10) {
                          pfVar22[5] = fVar56 * 32.0 + fVar54 + fVar43 + fVar47;
                        }
                        pfVar22 = pfVar22 + iVar10;
                      }
                      lVar14 = lVar14 + 1;
                      pfVar38 = pfVar38 + 8;
                    } while (lVar14 != 6);
                    pvVar23 = (void *)((long)pvVar23 + 1);
                    pfVar21 = pfVar21 + 1;
                  } while (pvVar23 != pvVar28);
                }
                local_888 = local_888 + 1;
                iVar27 = iVar27 + local_7bc;
              } while (local_888 != local_738);
            }
            iVar11 = iVar11 + local_7b4;
            uVar29 = local_800;
            uVar42 = local_7b4;
          } while (iVar11 < (int)local_800);
        }
        local_810 = local_810 + 1;
      } while (local_810 != local_7c0);
    }
    iVar10 = 0;
  }
  piVar8 = (int *)CONCAT44(local_7a0.refcount._4_4_,(int)local_7a0.refcount);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if (local_7a0.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_7a0.data != (Allocator *)0x0) {
          free(local_7a0.data);
        }
      }
      else {
        (*(local_7a0.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_0021227a:
  piVar8 = (int *)CONCAT44(local_720.refcount._4_4_,local_720.refcount._0_4_);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if (local_720.allocator == (Allocator *)0x0) {
        if (local_720.data != (void *)0x0) {
          free(local_720.data);
        }
      }
      else {
        (*(local_720.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar10;
}

Assistant:

static int conv3x3s1_winograd63(const Mat& bottom_blob, Mat& top_blob, const Mat& AT, const Mat& bias, int nT, const Option& opt)
{
    int outw = top_blob.w;
    int outh = top_blob.h;

    // pad to 6n+2, winograd F(6,3)
    int w_tiles = (outw + 5) / 6;
    int h_tiles = (outh + 5) / 6;
    int tiles = w_tiles * h_tiles;

    const int M = top_blob.c * top_blob.elempack;
    const int N = tiles;
    const int K = bottom_blob.c * bottom_blob.elempack;
    const int B = 64;

    // NCNN_LOGE("conv3x3s1_winograd63 %d %d %d", M, N, K);

    int TILE_M, TILE_N, TILE_K;
    get_optimal_tile_mnk(M, N, K, TILE_M, TILE_N, TILE_K, nT);

    const int nn_M = (M + TILE_M - 1) / TILE_M;
    const int nn_N = (N + TILE_N - 1) / TILE_N;
    const int nn_K = (K + TILE_K - 1) / TILE_K;

    // NCNN_LOGE("TILE M/N/K = %d %d %d -> %d %d %d", M, N, K, TILE_M, TILE_N, TILE_K);

    Mat BT(TILE_K * TILE_N, B, (K + TILE_K - 1) / TILE_K, (N + TILE_N - 1) / TILE_N, 4u, opt.workspace_allocator);
    if (BT.empty())
        return -100;

    const int nn_NK = nn_N * nn_K;

    if (nT > 1 && nn_NK < nT)
    {
        Mat B_tile(TILE_N * B * TILE_K, 4u, opt.workspace_allocator);
        if (B_tile.empty())
            return -100;

        for (int ppjk = 0; ppjk < nn_NK; ppjk++)
        {
            const int ppj = ppjk / nn_K;
            const int ppk = ppjk % nn_K;

            const int j = ppj * TILE_N;
            const int k = ppk * TILE_K;

            const int max_jj = std::min((N - j), TILE_N);
            const int max_kk = std::min((K - k), TILE_K);

            // transform input
            conv3x3s1_winograd63_transform_input_tile(bottom_blob, B_tile, j, max_jj, k, max_kk, nT);

            Mat BT_tile = BT.channel(j / TILE_N).depth(k / TILE_K);

            transpose_pack_B_tile(B_tile, BT_tile, B, max_jj, max_kk, nT);
        }
    }
    else
    {
        Mat B_tileX(TILE_N * B * TILE_K, 1, nT, 4u, opt.workspace_allocator);
        if (B_tileX.empty())
            return -100;

        #pragma omp parallel for num_threads(nT)
        for (int ppjk = 0; ppjk < nn_NK; ppjk++)
        {
            const int ppj = ppjk / nn_K;
            const int ppk = ppjk % nn_K;

            const int j = ppj * TILE_N;
            const int k = ppk * TILE_K;

            const int max_jj = std::min((N - j), TILE_N);
            const int max_kk = std::min((K - k), TILE_K);

            Mat B_tile = B_tileX.channel(get_omp_thread_num());

            // transform input
            conv3x3s1_winograd63_transform_input_tile(bottom_blob, B_tile, j, max_jj, k, max_kk, 1);

            Mat BT_tile = BT.channel(j / TILE_N).depth(k / TILE_K);

            transpose_pack_B_tile(B_tile, BT_tile, B, max_jj, max_kk, 1);
        }
    }

    Mat top_tileX(TILE_N * B * TILE_M, 1, nT, 4u, opt.workspace_allocator);
    if (top_tileX.empty())
        return -100;

    #pragma omp parallel for num_threads(nT)
    for (int ppj = 0; ppj < nn_M; ppj++)
    {
        const int i = ppj * TILE_M;

        Mat top_tile = top_tileX.channel(get_omp_thread_num());

        const int max_ii = std::min((M - i), TILE_M);

        for (int j = 0; j < N; j += TILE_N)
        {
            const int max_jj = std::min((N - j), TILE_N);

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_kk = std::min((K - k), TILE_K);

                const Mat AT_tile = AT.channel(i / TILE_M).depth(k / TILE_K);

                const Mat BT_tile = BT.channel(j / TILE_N).depth(k / TILE_K);

                gemm_transB_packed_tile(AT_tile, BT_tile, top_tile, B, max_ii, max_jj, k, max_kk);
            }

            // transform output
            conv3x3s1_winograd63_transform_output_tile(top_tile, top_blob, bias, i, max_ii, j, max_jj);
        }
    }

    return 0;
}